

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void amqp_dump(void *buffer,size_t len)

{
  int iVar1;
  long lVar2;
  ulong in_RSI;
  long in_RDI;
  int i_1;
  int ch;
  size_t i;
  int showed_dots;
  int oldchs [16];
  int chs [16];
  int numinrow;
  long count;
  uchar *buf;
  int in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  ulong uVar3;
  uint in_stack_ffffffffffffff50;
  int iVar4;
  uint local_a8 [16];
  uint local_68 [17];
  int local_24;
  long local_20;
  long local_18;
  ulong local_10;
  
  local_20 = 0;
  local_24 = 0;
  local_18 = in_RDI;
  local_10 = in_RSI;
  memset(local_a8,0,0x40);
  iVar4 = 0;
  for (uVar3 = 0; uVar3 < local_10; uVar3 = uVar3 + 1) {
    in_stack_ffffffffffffff44 = (uint)*(byte *)(local_18 + uVar3);
    if (local_24 == 0x10) {
      iVar1 = rows_eq((int *)local_a8,(int *)local_68);
      if (iVar1 == 0) {
        iVar4 = 0;
        dump_row((ulong)in_stack_ffffffffffffff50,(int)(uVar3 >> 0x20),
                 (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      }
      else if (iVar4 == 0) {
        iVar4 = 1;
        printf("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..\n");
      }
      for (in_stack_ffffffffffffff40 = 0; in_stack_ffffffffffffff40 < 0x10;
          in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + 1) {
        local_a8[in_stack_ffffffffffffff40] = local_68[in_stack_ffffffffffffff40];
      }
      local_24 = 0;
    }
    local_20 = local_20 + 1;
    lVar2 = (long)local_24;
    local_24 = local_24 + 1;
    local_68[lVar2] = in_stack_ffffffffffffff44;
  }
  dump_row(CONCAT44(iVar4,in_stack_ffffffffffffff50),(int)(uVar3 >> 0x20),
           (int *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  if (local_24 != 0) {
    printf("%08lX:\n",local_20);
  }
  return;
}

Assistant:

void amqp_dump(void const *buffer, size_t len)
{
  unsigned char *buf = (unsigned char *) buffer;
  long count = 0;
  int numinrow = 0;
  int chs[16];
  int oldchs[16] = {0};
  int showed_dots = 0;
  size_t i;

  for (i = 0; i < len; i++) {
    int ch = buf[i];

    if (numinrow == 16) {
      int i;

      if (rows_eq(oldchs, chs)) {
        if (!showed_dots) {
          showed_dots = 1;
          printf("          .. .. .. .. .. .. .. .. : .. .. .. .. .. .. .. ..\n");
        }
      } else {
        showed_dots = 0;
        dump_row(count, numinrow, chs);
      }

      for (i=0; i<16; i++) {
        oldchs[i] = chs[i];
      }

      numinrow = 0;
    }

    count++;
    chs[numinrow++] = ch;
  }

  dump_row(count, numinrow, chs);

  if (numinrow != 0) {
    printf("%08lX:\n", count);
  }
}